

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_variable_create
                    (gtoken_s token,char *identifier,char *annotation_type,gnode_t *expr,
                    gnode_t *decl,gnode_variable_decl_t *vdecl)

{
  gnode_t *pgVar1;
  gnode_var_t *node;
  gnode_variable_decl_t *vdecl_local;
  gnode_t *decl_local;
  gnode_t *expr_local;
  char *annotation_type_local;
  char *identifier_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x78);
  pgVar1->tag = NODE_VARIABLE;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  *(char **)&pgVar1[1].block_length = identifier;
  *(char **)&pgVar1[1].token = annotation_type;
  *(gnode_t **)&pgVar1[1].token.colno = expr;
  *(gnode_variable_decl_t **)&pgVar1[1].token.fileid = vdecl;
  *(undefined1 *)((long)&pgVar1[1].token.length + 3) = 0;
  return pgVar1;
}

Assistant:

gnode_t *gnode_variable_create (gtoken_s token, const char *identifier, const char *annotation_type, gnode_t *expr, gnode_t *decl, gnode_variable_decl_t *vdecl) {
    gnode_var_t *node = (gnode_var_t *)mem_alloc(NULL, sizeof(gnode_var_t));

    SETBASE(node, NODE_VARIABLE, token);
    SETDECL(node, decl);
    node->identifier = identifier;
    node->annotation_type = annotation_type;
    node->expr = expr;
    node->vdecl = vdecl;
    node->iscomputed = false;
    return (gnode_t *)node;
}